

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_get_format_string(bcf_hdr_t *hdr,bcf1_t *line,char *tag,char ***dst,int *ndst)

{
  bcf_fmt_t *pbVar1;
  uint uVar2;
  int iVar3;
  char **ppcVar4;
  char *pcVar5;
  uint8_t *tmp;
  uint8_t *src;
  int n;
  int nsmpl;
  bcf_fmt_t *fmt;
  int tag_id;
  int i;
  int *ndst_local;
  char ***dst_local;
  char *tag_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  iVar3 = bcf_hdr_id2int(hdr,0,tag);
  if ((iVar3 < 0) || (((hdr->id[0][iVar3].val)->info[2] & 0xf) == 0xf)) {
    hdr_local._4_4_ = -1;
  }
  else if (((hdr->id[0][iVar3].val)->info[2] >> 4 & 0xf) == 3) {
    if ((line->unpacked & 8U) == 0) {
      bcf_unpack(line,8);
    }
    fmt._4_4_ = 0;
    while ((uVar2 = fmt._4_4_,
           (int)fmt._4_4_ < (int)((uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20) & 0xff) &&
           ((line->d).fmt[(int)fmt._4_4_].id != iVar3))) {
      fmt._4_4_ = fmt._4_4_ + 1;
    }
    if (fmt._4_4_ == ((uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20) & 0xff)) {
      hdr_local._4_4_ = -3;
    }
    else {
      pbVar1 = (line->d).fmt;
      iVar3 = hdr->n[2];
      if (*dst == (char **)0x0) {
        ppcVar4 = (char **)malloc((long)iVar3 << 3);
        *dst = ppcVar4;
        if (*dst == (char **)0x0) {
          return -4;
        }
        **dst = (char *)0x0;
      }
      hdr_local._4_4_ = (pbVar1[(int)fmt._4_4_].n + 1) * iVar3;
      if (*ndst < hdr_local._4_4_) {
        pcVar5 = (char *)realloc(**dst,(long)hdr_local._4_4_);
        **dst = pcVar5;
        if (**dst == (char *)0x0) {
          return -4;
        }
        *ndst = hdr_local._4_4_;
      }
      for (fmt._4_4_ = 0; (int)fmt._4_4_ < iVar3; fmt._4_4_ = fmt._4_4_ + 1) {
        pcVar5 = **dst + (int)(fmt._4_4_ * (pbVar1[(int)uVar2].n + 1));
        memcpy(pcVar5,pbVar1[(int)uVar2].p + (int)(fmt._4_4_ * pbVar1[(int)uVar2].n),
               (long)pbVar1[(int)uVar2].n);
        pcVar5[pbVar1[(int)uVar2].n] = '\0';
        (*dst)[(int)fmt._4_4_] = pcVar5;
      }
    }
  }
  else {
    hdr_local._4_4_ = -2;
  }
  return hdr_local._4_4_;
}

Assistant:

int bcf_get_format_string(const bcf_hdr_t *hdr, bcf1_t *line, const char *tag, char ***dst, int *ndst)
{
    int i,tag_id = bcf_hdr_id2int(hdr, BCF_DT_ID, tag);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,tag_id) ) return -1;    // no such FORMAT field in the header
    if ( bcf_hdr_id2type(hdr,BCF_HL_FMT,tag_id)!=BCF_HT_STR ) return -2;     // expected different type

    if ( !(line->unpacked & BCF_UN_FMT) ) bcf_unpack(line, BCF_UN_FMT);

    for (i=0; i<line->n_fmt; i++)
        if ( line->d.fmt[i].id==tag_id ) break;
    if ( i==line->n_fmt ) return -3;                               // the tag is not present in this record
    bcf_fmt_t *fmt = &line->d.fmt[i];

    int nsmpl = bcf_hdr_nsamples(hdr);
    if ( !*dst )
    {
        *dst = (char**) malloc(sizeof(char*)*nsmpl);
        if ( !*dst ) return -4;     // could not alloc
        (*dst)[0] = NULL;
    }
    int n = (fmt->n+1)*nsmpl;
    if ( *ndst < n )
    {
        (*dst)[0] = realloc((*dst)[0], n);
        if ( !(*dst)[0] ) return -4;    // could not alloc
        *ndst = n;
    }
    for (i=0; i<nsmpl; i++)
    {
        uint8_t *src = fmt->p + i*fmt->n;
        uint8_t *tmp = (uint8_t*)(*dst)[0] + i*(fmt->n+1);
        memcpy(tmp,src,fmt->n);
        tmp[fmt->n] = 0;
        (*dst)[i] = (char*) tmp;
    }
    return n;
}